

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constant.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::TIntermConstantUnion::fold(TIntermConstantUnion *this,TOperator op,TType *returnType)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  byte bVar4;
  uchar uVar5;
  short sVar6;
  unsigned_short uVar7;
  int iVar8;
  undefined4 uVar9;
  TBasicType TVar10;
  uint uVar11;
  undefined4 extraout_var;
  TConstUnionArray *this_00;
  TConstUnion *pTVar12;
  TConstUnion *pTVar13;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  longlong lVar14;
  undefined4 extraout_var_02;
  anon_union_8_11_a9b10978_for_TConstUnion_0 *paVar15;
  undefined4 extraout_var_03;
  long lVar16;
  undefined4 extraout_var_04;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  TConstUnion TVar21;
  double local_298;
  uint local_264;
  int local_254;
  unsigned_long_long local_1b0;
  uint local_174;
  TIntermConstantUnion *newNode;
  double x;
  double rounded;
  bool even;
  double flr;
  int64_t i64val;
  ulong uStack_a8;
  bool valb;
  int64_t vali;
  uint64_t valu;
  double valf;
  int local_88;
  ConvType dstType;
  ConvType srcType;
  int i_4;
  bool local_75;
  int i_3;
  bool result_1;
  int i_2;
  bool result;
  int i_1;
  double length;
  double dStack_58;
  int i;
  double sum;
  TConstUnionArray *unionArray;
  TConstUnionArray newConstArray;
  int objectSize;
  bool componentWise;
  int resultSize;
  TType *returnType_local;
  TOperator op_local;
  TIntermConstantUnion *this_local;
  
  bVar2 = true;
  iVar8 = (*(this->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
  newConstArray.unionArray._4_4_ =
       TType::computeNumComponents((TType *)CONCAT44(extraout_var,iVar8));
  if (op == EOpPackSnorm2x16) {
LAB_006fc3d6:
    bVar2 = false;
    objectSize = 1;
  }
  else if (op == EOpUnpackSnorm2x16) {
LAB_006fc3e3:
    bVar2 = false;
    objectSize = 2;
  }
  else {
    if (op == EOpPackUnorm2x16) goto LAB_006fc3d6;
    if (op == EOpUnpackUnorm2x16) goto LAB_006fc3e3;
    if (op == EOpPackHalf2x16) goto LAB_006fc3d6;
    if (op == EOpUnpackHalf2x16) goto LAB_006fc3e3;
    objectSize = newConstArray.unionArray._4_4_;
    if (op - EOpPack16 < 6) {
LAB_006fc3f0:
      bVar2 = false;
    }
    else {
      if (op != EOpLength) {
        if (op == EOpNormalize) goto LAB_006fc3f0;
        if (op != EOpDeterminant) {
          if (op - EOpEmitStreamVertex < 2) {
            return (TIntermTyped *)0x0;
          }
          if (op != EOpAny && op != EOpAll) goto LAB_006fc402;
        }
      }
      bVar2 = false;
      objectSize = 1;
    }
  }
LAB_006fc402:
  local_1b0 = (unsigned_long_long)(uint)objectSize;
  TConstUnionArray::TConstUnionArray((TConstUnionArray *)&unionArray,objectSize);
  this_00 = getConstArray(this);
  if (((op - EOpPackSnorm2x16 < 4) || (op - EOpPackHalf2x16 < 2)) || (op - EOpPack16 < 6)) {
LAB_006fc679:
    this_local = (TIntermConstantUnion *)0x0;
  }
  else {
    if ((op == EOpLength) || (op == EOpNormalize)) {
      dStack_58 = 0.0;
      for (length._4_4_ = 0; length._4_4_ < newConstArray.unionArray._4_4_;
          length._4_4_ = length._4_4_ + 1) {
        pTVar13 = TConstUnionArray::operator[](this_00,(long)length._4_4_);
        dVar17 = TConstUnion::getDConst(pTVar13);
        local_1b0 = (unsigned_long_long)length._4_4_;
        pTVar13 = TConstUnionArray::operator[](this_00,local_1b0);
        dVar18 = TConstUnion::getDConst(pTVar13);
        dStack_58 = dVar17 * dVar18 + dStack_58;
      }
      dVar17 = sqrt(dStack_58);
      if (op == EOpLength) {
        local_1b0 = 0;
        pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,0);
        TConstUnion::setDConst(pTVar13,dVar17);
      }
      else {
        for (i_2 = 0; i_2 < newConstArray.unionArray._4_4_; i_2 = i_2 + 1) {
          pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)i_2);
          local_1b0 = (unsigned_long_long)i_2;
          pTVar12 = TConstUnionArray::operator[](this_00,local_1b0);
          dVar18 = TConstUnion::getDConst(pTVar12);
          TConstUnion::setDConst(pTVar13,dVar18 / dVar17);
        }
      }
    }
    else {
      if (op - EOpDeterminant < 3) goto LAB_006fc679;
      if (op == EOpAny) {
        result_1 = false;
        for (i_3 = 0; i_3 < newConstArray.unionArray._4_4_; i_3 = i_3 + 1) {
          pTVar13 = TConstUnionArray::operator[](this_00,(long)i_3);
          bVar1 = TConstUnion::getBConst(pTVar13);
          if (bVar1) {
            result_1 = true;
          }
        }
        pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,0);
        local_1b0 = (unsigned_long_long)result_1;
        TConstUnion::setBConst(pTVar13,result_1);
      }
      else if (op == EOpAll) {
        local_75 = true;
        for (i_4 = 0; i_4 < newConstArray.unionArray._4_4_; i_4 = i_4 + 1) {
          pTVar13 = TConstUnionArray::operator[](this_00,(long)i_4);
          bVar1 = TConstUnion::getBConst(pTVar13);
          if (!bVar1) {
            local_75 = false;
          }
        }
        pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,0);
        local_1b0 = (unsigned_long_long)local_75;
        TConstUnion::setBConst(pTVar13,local_75);
      }
      else if (!bVar2) {
        __assert_fail("componentWise",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/Constant.cpp"
                      ,0x1e3,
                      "virtual TIntermTyped *glslang::TIntermConstantUnion::fold(TOperator, const TType &) const"
                     );
      }
    }
    if (!bVar2) {
      newConstArray.unionArray._4_4_ = 0;
    }
    for (dstType = CONV_FLOAT; (int)dstType < newConstArray.unionArray._4_4_;
        dstType = dstType + CONV_INT) {
      bVar2 = IsOpNumericConv(op);
      if (bVar2) {
        valu = 0;
        vali = 0;
        uStack_a8 = 0;
        i64val._7_1_ = false;
        iVar8 = (*(this->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
        uVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar8) + 0x38))();
        switch(uVar9) {
        case 1:
        case 2:
        case 3:
          pTVar13 = TConstUnionArray::operator[](this_00,(long)(int)dstType);
          valu = (uint64_t)TConstUnion::getDConst(pTVar13);
          local_88 = 0;
          break;
        case 4:
          pTVar13 = TConstUnionArray::operator[](this_00,(long)(int)dstType);
          cVar3 = TConstUnion::getI8Const(pTVar13);
          uStack_a8 = (ulong)cVar3;
          local_88 = 1;
          break;
        case 5:
          pTVar13 = TConstUnionArray::operator[](this_00,(long)(int)dstType);
          bVar4 = TConstUnion::getU8Const(pTVar13);
          vali = (int64_t)bVar4;
          local_88 = 2;
          break;
        case 6:
          pTVar13 = TConstUnionArray::operator[](this_00,(long)(int)dstType);
          sVar6 = TConstUnion::getI16Const(pTVar13);
          uStack_a8 = (ulong)sVar6;
          local_88 = 1;
          break;
        case 7:
          pTVar13 = TConstUnionArray::operator[](this_00,(long)(int)dstType);
          uVar7 = TConstUnion::getU16Const(pTVar13);
          vali = (int64_t)uVar7;
          local_88 = 2;
          break;
        case 8:
          pTVar13 = TConstUnionArray::operator[](this_00,(long)(int)dstType);
          iVar8 = TConstUnion::getIConst(pTVar13);
          uStack_a8 = (ulong)iVar8;
          local_88 = 1;
          break;
        case 9:
          pTVar13 = TConstUnionArray::operator[](this_00,(long)(int)dstType);
          uVar11 = TConstUnion::getUConst(pTVar13);
          vali = (int64_t)uVar11;
          local_88 = 2;
          break;
        case 10:
          pTVar13 = TConstUnionArray::operator[](this_00,(long)(int)dstType);
          uStack_a8 = TConstUnion::getI64Const(pTVar13);
          local_88 = 1;
          break;
        case 0xb:
          pTVar13 = TConstUnionArray::operator[](this_00,(long)(int)dstType);
          vali = TConstUnion::getU64Const(pTVar13);
          local_88 = 2;
          break;
        case 0xc:
          pTVar13 = TConstUnionArray::operator[](this_00,(long)(int)dstType);
          i64val._7_1_ = TConstUnion::getBConst(pTVar13);
          local_88 = 3;
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/Constant.cpp"
                        ,0x223,
                        "virtual TIntermTyped *glslang::TIntermConstantUnion::fold(TOperator, const TType &) const"
                       );
        }
        iVar8 = (*returnType->_vptr_TType[7])();
        switch(iVar8) {
        case 1:
        case 2:
        case 3:
          valf._4_4_ = 0;
          break;
        case 4:
        case 6:
        case 8:
        case 10:
          valf._4_4_ = 1;
          break;
        case 5:
        case 7:
        case 9:
        case 0xb:
          valf._4_4_ = 2;
          break;
        case 0xc:
          valf._4_4_ = 3;
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/Constant.cpp"
                        ,0x23d,
                        "virtual TIntermTyped *glslang::TIntermConstantUnion::fold(TOperator, const TType &) const"
                       );
        }
        uVar9 = (undefined4)((ulong)vali >> 0x20);
        if (valf._4_4_ == 3) {
          if (local_88 == 0) {
            i64val._7_1_ = (double)valu != 0.0;
          }
          else if (local_88 == 1) {
            i64val._7_1_ = (double)(long)uStack_a8 != 0.0;
          }
          else if (local_88 == 2) {
            auVar19._8_4_ = uVar9;
            auVar19._0_8_ = vali;
            auVar19._12_4_ = 0x45300000;
            i64val._7_1_ = (auVar19._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)vali) - 4503599627370496.0) != 0.0;
          }
        }
        else if (valf._4_4_ == 0) {
          if (local_88 == 1) {
            valu = (uint64_t)(double)(long)uStack_a8;
          }
          else if (local_88 == 2) {
            auVar20._8_4_ = uVar9;
            auVar20._0_8_ = vali;
            auVar20._12_4_ = 0x45300000;
            valu = (uint64_t)
                   ((auVar20._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)vali) - 4503599627370496.0));
          }
          else if (local_88 == 3) {
            valu = (uint64_t)(double)i64val._7_1_;
          }
        }
        else if (valf._4_4_ == 1) {
          if (local_88 == 0) {
            uStack_a8 = (ulong)(double)valu;
          }
          else if (local_88 == 2) {
            uStack_a8 = vali;
          }
          else if (local_88 == 3) {
            uStack_a8 = (ulong)i64val._7_1_;
          }
        }
        else if (valf._4_4_ == 2) {
          if (local_88 == 0) {
            vali = (long)(double)valu |
                   (long)((double)valu - 9.223372036854776e+18) & (long)(double)valu >> 0x3f;
          }
          else if (local_88 == 1) {
            vali = uStack_a8;
          }
          else if (local_88 == 3) {
            vali = (int64_t)i64val._7_1_;
          }
        }
        iVar8 = (*returnType->_vptr_TType[7])();
        switch(iVar8) {
        case 1:
        case 2:
        case 3:
          local_1b0 = (unsigned_long_long)(int)dstType;
          pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,local_1b0);
          TConstUnion::setDConst(pTVar13,(double)valu);
          break;
        case 4:
          pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType)
          ;
          local_1b0 = (unsigned_long_long)(uint)(int)(char)uStack_a8;
          TConstUnion::setI8Const(pTVar13,(char)uStack_a8);
          break;
        case 5:
          pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType)
          ;
          local_1b0 = vali & 0xff;
          TConstUnion::setU8Const(pTVar13,(uchar)vali);
          break;
        case 6:
          pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType)
          ;
          local_1b0 = (unsigned_long_long)(uint)(int)(short)uStack_a8;
          TConstUnion::setI16Const(pTVar13,(short)uStack_a8);
          break;
        case 7:
          pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType)
          ;
          local_1b0 = vali & 0xffff;
          TConstUnion::setU16Const(pTVar13,(unsigned_short)vali);
          break;
        case 8:
          pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType)
          ;
          local_1b0 = uStack_a8 & 0xffffffff;
          TConstUnion::setIConst(pTVar13,(int)uStack_a8);
          break;
        case 9:
          pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType)
          ;
          local_1b0 = vali & 0xffffffff;
          TConstUnion::setUConst(pTVar13,(uint)vali);
          break;
        case 10:
          pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType)
          ;
          TConstUnion::setI64Const(pTVar13,uStack_a8);
          local_1b0 = uStack_a8;
          break;
        case 0xb:
          pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType)
          ;
          TConstUnion::setU64Const(pTVar13,vali);
          local_1b0 = vali;
          break;
        case 0xc:
          pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType)
          ;
          local_1b0 = (unsigned_long_long)i64val._7_1_;
          TConstUnion::setBConst(pTVar13,i64val._7_1_);
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/Constant.cpp"
                        ,0x285,
                        "virtual TIntermTyped *glslang::TIntermConstantUnion::fold(TOperator, const TType &) const"
                       );
        }
        goto LAB_006fdb99;
      }
      switch(op) {
      case EOpNegative:
        iVar8 = (*(this->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
        uVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar8) + 0x38))();
        switch(uVar9) {
        case 1:
        case 2:
        case 3:
          pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType)
          ;
          local_1b0 = (unsigned_long_long)(int)dstType;
          pTVar12 = TConstUnionArray::operator[](this_00,local_1b0);
          dVar17 = TConstUnion::getDConst(pTVar12);
          TConstUnion::setDConst(pTVar13,-dVar17);
          break;
        case 4:
          pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType)
          ;
          pTVar12 = TConstUnionArray::operator[](this_00,(long)(int)dstType);
          cVar3 = TConstUnion::getI8Const(pTVar12);
          local_1b0 = (unsigned_long_long)(uint)(int)-cVar3;
          TConstUnion::setI8Const(pTVar13,-cVar3);
          break;
        case 5:
          pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType)
          ;
          pTVar12 = TConstUnionArray::operator[](this_00,(long)(int)dstType);
          uVar5 = TConstUnion::getU8Const(pTVar12);
          local_1b0 = (unsigned_long_long)(byte)-uVar5;
          TConstUnion::setU8Const(pTVar13,-uVar5);
          break;
        case 6:
          pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType)
          ;
          pTVar12 = TConstUnionArray::operator[](this_00,(long)(int)dstType);
          sVar6 = TConstUnion::getI16Const(pTVar12);
          local_1b0 = (unsigned_long_long)(uint)(int)-sVar6;
          TConstUnion::setI16Const(pTVar13,-sVar6);
          break;
        case 7:
          pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType)
          ;
          pTVar12 = TConstUnionArray::operator[](this_00,(long)(int)dstType);
          uVar7 = TConstUnion::getU16Const(pTVar12);
          local_1b0 = (unsigned_long_long)(ushort)-uVar7;
          TConstUnion::setU16Const(pTVar13,-uVar7);
          break;
        case 8:
          pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType)
          ;
          pTVar12 = TConstUnionArray::operator[](this_00,(long)(int)dstType);
          iVar8 = TConstUnion::getIConst(pTVar12);
          if (iVar8 == -0x80000000) {
            local_174 = 0x80000000;
          }
          else {
            pTVar12 = TConstUnionArray::operator[](this_00,(long)(int)dstType);
            iVar8 = TConstUnion::getIConst(pTVar12);
            local_174 = -iVar8;
          }
          local_1b0 = (unsigned_long_long)local_174;
          TConstUnion::setIConst(pTVar13,local_174);
          break;
        case 9:
          pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType)
          ;
          pTVar12 = TConstUnionArray::operator[](this_00,(long)(int)dstType);
          uVar11 = TConstUnion::getUConst(pTVar12);
          local_1b0 = (unsigned_long_long)-uVar11;
          TConstUnion::setUConst(pTVar13,-uVar11);
          break;
        case 10:
          pTVar13 = TConstUnionArray::operator[](this_00,(long)(int)dstType);
          lVar14 = TConstUnion::getI64Const(pTVar13);
          pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType)
          ;
          if (lVar14 == -0x8000000000000000) {
            local_1b0 = 0x8000000000000000;
          }
          else {
            local_1b0 = -lVar14;
          }
          TConstUnion::setI64Const(pTVar13,local_1b0);
          break;
        case 0xb:
          pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType)
          ;
          pTVar12 = TConstUnionArray::operator[](this_00,(long)(int)dstType);
          local_1b0 = TConstUnion::getU64Const(pTVar12);
          local_1b0 = -local_1b0;
          TConstUnion::setU64Const(pTVar13,local_1b0);
          break;
        default:
          this_local = (TIntermConstantUnion *)0x0;
          goto LAB_006fdc3b;
        }
        break;
      case EOpLogicalNot:
      case EOpVectorLogicalNot:
        iVar8 = (*(this->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
        iVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar8) + 0x38))();
        if (iVar8 != 0xc) {
          this_local = (TIntermConstantUnion *)0x0;
          goto LAB_006fdc3b;
        }
        pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)(int)dstType);
        bVar2 = TConstUnion::getBConst(pTVar12);
        uVar11 = (bVar2 ^ 0xff) & 1;
        local_1b0 = (unsigned_long_long)uVar11;
        TConstUnion::setBConst(pTVar13,SUB41(uVar11,0));
        break;
      case EOpBitwiseNot:
        pTVar13 = TConstUnionArray::operator[](this_00,(long)(int)dstType);
        TVar21 = TConstUnion::operator~(pTVar13);
        local_1b0 = (unsigned_long_long)(int)dstType;
        paVar15 = &TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,local_1b0)->field_0;
        paVar15->i64Const = (longlong)TVar21.field_0;
        paVar15[1].iConst = TVar21.type;
        break;
      default:
        goto switchD_006fcdf3_caseD_c;
      case EOpConvUint64ToPtr:
      case EOpConvPtrToUint64:
      case EOpConstructReference:
        pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)(int)dstType);
        local_1b0 = TConstUnion::getU64Const(pTVar12);
        TConstUnion::setU64Const(pTVar13,local_1b0);
        break;
      case EOpRadians:
        pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType);
        local_1b0 = (unsigned_long_long)(int)dstType;
        pTVar12 = TConstUnionArray::operator[](this_00,local_1b0);
        dVar17 = TConstUnion::getDConst(pTVar12);
        TConstUnion::setDConst(pTVar13,(dVar17 * 3.141592653589793) / 180.0);
        break;
      case EOpDegrees:
        pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType);
        local_1b0 = (unsigned_long_long)(int)dstType;
        pTVar12 = TConstUnionArray::operator[](this_00,local_1b0);
        dVar17 = TConstUnion::getDConst(pTVar12);
        TConstUnion::setDConst(pTVar13,(dVar17 * 180.0) / 3.141592653589793);
        break;
      case EOpSin:
        pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType);
        local_1b0 = (unsigned_long_long)(int)dstType;
        pTVar12 = TConstUnionArray::operator[](this_00,local_1b0);
        dVar17 = TConstUnion::getDConst(pTVar12);
        dVar17 = sin(dVar17);
        TConstUnion::setDConst(pTVar13,dVar17);
        break;
      case EOpCos:
        pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType);
        local_1b0 = (unsigned_long_long)(int)dstType;
        pTVar12 = TConstUnionArray::operator[](this_00,local_1b0);
        dVar17 = TConstUnion::getDConst(pTVar12);
        dVar17 = cos(dVar17);
        TConstUnion::setDConst(pTVar13,dVar17);
        break;
      case EOpTan:
        pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType);
        local_1b0 = (unsigned_long_long)(int)dstType;
        pTVar12 = TConstUnionArray::operator[](this_00,local_1b0);
        dVar17 = TConstUnion::getDConst(pTVar12);
        dVar17 = tan(dVar17);
        TConstUnion::setDConst(pTVar13,dVar17);
        break;
      case EOpAsin:
        pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType);
        local_1b0 = (unsigned_long_long)(int)dstType;
        pTVar12 = TConstUnionArray::operator[](this_00,local_1b0);
        dVar17 = TConstUnion::getDConst(pTVar12);
        dVar17 = asin(dVar17);
        TConstUnion::setDConst(pTVar13,dVar17);
        break;
      case EOpAcos:
        pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType);
        local_1b0 = (unsigned_long_long)(int)dstType;
        pTVar12 = TConstUnionArray::operator[](this_00,local_1b0);
        dVar17 = TConstUnion::getDConst(pTVar12);
        dVar17 = acos(dVar17);
        TConstUnion::setDConst(pTVar13,dVar17);
        break;
      case EOpAtan:
        pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType);
        local_1b0 = (unsigned_long_long)(int)dstType;
        pTVar12 = TConstUnionArray::operator[](this_00,local_1b0);
        dVar17 = TConstUnion::getDConst(pTVar12);
        dVar17 = atan(dVar17);
        TConstUnion::setDConst(pTVar13,dVar17);
        break;
      case EOpSinh:
      case EOpCosh:
      case EOpTanh:
      case EOpAsinh:
      case EOpAcosh:
      case EOpAtanh:
      case EOpFloatBitsToInt:
      case EOpFloatBitsToUint:
      case EOpIntBitsToFloat:
      case EOpUintBitsToFloat:
      case EOpDoubleBitsToInt64:
      case EOpDoubleBitsToUint64:
      case EOpInt64BitsToDouble:
      case EOpUint64BitsToDouble:
      case EOpFloat16BitsToInt16:
      case EOpFloat16BitsToUint16:
      case EOpInt16BitsToFloat16:
      case EOpUint16BitsToFloat16:
switchD_006fcdf3_caseD_c:
        this_local = (TIntermConstantUnion *)0x0;
        goto LAB_006fdc3b;
      case EOpExp:
        pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType);
        local_1b0 = (unsigned_long_long)(int)dstType;
        pTVar12 = TConstUnionArray::operator[](this_00,local_1b0);
        dVar17 = TConstUnion::getDConst(pTVar12);
        dVar17 = exp(dVar17);
        TConstUnion::setDConst(pTVar13,dVar17);
        break;
      case EOpLog:
        pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType);
        local_1b0 = (unsigned_long_long)(int)dstType;
        pTVar12 = TConstUnionArray::operator[](this_00,local_1b0);
        dVar17 = TConstUnion::getDConst(pTVar12);
        dVar17 = log(dVar17);
        TConstUnion::setDConst(pTVar13,dVar17);
        break;
      case EOpExp2:
        pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType);
        local_1b0 = (unsigned_long_long)(int)dstType;
        pTVar12 = TConstUnionArray::operator[](this_00,local_1b0);
        dVar17 = TConstUnion::getDConst(pTVar12);
        dVar17 = exp2(dVar17);
        TConstUnion::setDConst(pTVar13,dVar17);
        break;
      case EOpLog2:
        pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType);
        local_1b0 = (unsigned_long_long)(int)dstType;
        pTVar12 = TConstUnionArray::operator[](this_00,local_1b0);
        dVar17 = TConstUnion::getDConst(pTVar12);
        dVar17 = log2(dVar17);
        TConstUnion::setDConst(pTVar13,dVar17);
        break;
      case EOpSqrt:
        pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType);
        local_1b0 = (unsigned_long_long)(int)dstType;
        pTVar12 = TConstUnionArray::operator[](this_00,local_1b0);
        dVar17 = TConstUnion::getDConst(pTVar12);
        dVar17 = sqrt(dVar17);
        TConstUnion::setDConst(pTVar13,dVar17);
        break;
      case EOpInverseSqrt:
        pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType);
        local_1b0 = (unsigned_long_long)(int)dstType;
        pTVar12 = TConstUnionArray::operator[](this_00,local_1b0);
        dVar17 = TConstUnion::getDConst(pTVar12);
        dVar17 = sqrt(dVar17);
        TConstUnion::setDConst(pTVar13,1.0 / dVar17);
        break;
      case EOpAbs:
        pTVar13 = TConstUnionArray::operator[](this_00,(long)(int)dstType);
        TVar10 = TConstUnion::getType(pTVar13);
        if (TVar10 == EbtDouble) {
          pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType)
          ;
          local_1b0 = (unsigned_long_long)(int)dstType;
          pTVar12 = TConstUnionArray::operator[](this_00,local_1b0);
          dVar17 = TConstUnion::getDConst(pTVar12);
          TConstUnion::setDConst(pTVar13,(double)((ulong)dVar17 & (ulong)DAT_00e860d0));
        }
        else {
          pTVar13 = TConstUnionArray::operator[](this_00,(long)(int)dstType);
          TVar10 = TConstUnion::getType(pTVar13);
          if (TVar10 == EbtInt) {
            pTVar13 = TConstUnionArray::operator[]
                                ((TConstUnionArray *)&unionArray,(long)(int)dstType);
            pTVar12 = TConstUnionArray::operator[](this_00,(long)(int)dstType);
            uVar11 = TConstUnion::getIConst(pTVar12);
            if ((int)uVar11 < 1) {
              uVar11 = -uVar11;
            }
            local_1b0 = (unsigned_long_long)uVar11;
            TConstUnion::setIConst(pTVar13,uVar11);
          }
          else {
            pTVar13 = TConstUnionArray::operator[](this_00,(long)(int)dstType);
            local_1b0 = (unsigned_long_long)(int)dstType;
            pTVar12 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,local_1b0);
            pTVar12->field_0 = pTVar13->field_0;
            pTVar12->type = pTVar13->type;
          }
        }
        break;
      case EOpSign:
        pTVar13 = TConstUnionArray::operator[](this_00,(long)(int)dstType);
        TVar10 = TConstUnion::getType(pTVar13);
        if (TVar10 == EbtDouble) {
          pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType)
          ;
          local_1b0 = (unsigned_long_long)(int)dstType;
          pTVar12 = TConstUnionArray::operator[](this_00,local_1b0);
          dVar17 = TConstUnion::getDConst(pTVar12);
          if ((dVar17 != 0.0) || (NAN(dVar17))) {
            local_1b0 = (unsigned_long_long)(int)dstType;
            pTVar12 = TConstUnionArray::operator[](this_00,local_1b0);
            dVar17 = TConstUnion::getDConst(pTVar12);
            local_254 = 1;
            if (dVar17 < 0.0) {
              local_254 = -1;
            }
          }
          else {
            local_254 = 0;
          }
          TConstUnion::setDConst(pTVar13,(double)local_254);
        }
        else {
          pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType)
          ;
          pTVar12 = TConstUnionArray::operator[](this_00,(long)(int)dstType);
          iVar8 = TConstUnion::getIConst(pTVar12);
          if (iVar8 == 0) {
            local_264 = 0;
          }
          else {
            pTVar12 = TConstUnionArray::operator[](this_00,(long)(int)dstType);
            iVar8 = TConstUnion::getIConst(pTVar12);
            local_264 = 1;
            if (iVar8 < 0) {
              local_264 = 0xffffffff;
            }
          }
          local_1b0 = (unsigned_long_long)local_264;
          TConstUnion::setIConst(pTVar13,local_264);
        }
        break;
      case EOpFloor:
        pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType);
        local_1b0 = (unsigned_long_long)(int)dstType;
        pTVar12 = TConstUnionArray::operator[](this_00,local_1b0);
        dVar17 = TConstUnion::getDConst(pTVar12);
        dVar17 = floor(dVar17);
        TConstUnion::setDConst(pTVar13,dVar17);
        break;
      case EOpTrunc:
        pTVar13 = TConstUnionArray::operator[](this_00,(long)(int)dstType);
        dVar17 = TConstUnion::getDConst(pTVar13);
        if (dVar17 <= 0.0) {
          pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType)
          ;
          local_1b0 = (unsigned_long_long)(int)dstType;
          pTVar12 = TConstUnionArray::operator[](this_00,local_1b0);
          dVar17 = TConstUnion::getDConst(pTVar12);
          dVar17 = ceil(dVar17);
          TConstUnion::setDConst(pTVar13,dVar17);
        }
        else {
          pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType)
          ;
          local_1b0 = (unsigned_long_long)(int)dstType;
          pTVar12 = TConstUnionArray::operator[](this_00,local_1b0);
          dVar17 = TConstUnion::getDConst(pTVar12);
          dVar17 = floor(dVar17);
          TConstUnion::setDConst(pTVar13,dVar17);
        }
        break;
      case EOpRound:
        pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType);
        local_1b0 = (unsigned_long_long)(int)dstType;
        pTVar12 = TConstUnionArray::operator[](this_00,local_1b0);
        dVar17 = TConstUnion::getDConst(pTVar12);
        dVar17 = floor(dVar17 + 0.5);
        TConstUnion::setDConst(pTVar13,dVar17);
        break;
      case EOpRoundEven:
        pTVar13 = TConstUnionArray::operator[](this_00,(long)(int)dstType);
        dVar17 = TConstUnion::getDConst(pTVar13);
        dVar17 = floor(dVar17);
        dVar18 = floor(dVar17 / 2.0);
        if (dVar17 / 2.0 == dVar18) {
          pTVar13 = TConstUnionArray::operator[](this_00,(long)(int)dstType);
          dVar17 = TConstUnion::getDConst(pTVar13);
          local_298 = ceil(dVar17 - 0.5);
        }
        else {
          pTVar13 = TConstUnionArray::operator[](this_00,(long)(int)dstType);
          dVar17 = TConstUnion::getDConst(pTVar13);
          local_298 = floor(dVar17 + 0.5);
        }
        local_1b0 = (unsigned_long_long)(int)dstType;
        pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,local_1b0);
        TConstUnion::setDConst(pTVar13,local_298);
        break;
      case EOpCeil:
        pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType);
        local_1b0 = (unsigned_long_long)(int)dstType;
        pTVar12 = TConstUnionArray::operator[](this_00,local_1b0);
        dVar17 = TConstUnion::getDConst(pTVar12);
        dVar17 = ceil(dVar17);
        TConstUnion::setDConst(pTVar13,dVar17);
        break;
      case EOpFract:
        pTVar13 = TConstUnionArray::operator[](this_00,(long)(int)dstType);
        dVar17 = TConstUnion::getDConst(pTVar13);
        local_1b0 = (unsigned_long_long)(int)dstType;
        pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,local_1b0);
        dVar18 = floor(dVar17);
        TConstUnion::setDConst(pTVar13,dVar17 - dVar18);
        break;
      case EOpIsNan:
        pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)(int)dstType);
        dVar17 = TConstUnion::getDConst(pTVar12);
        uVar11 = std::isnan(dVar17);
        local_1b0 = (unsigned_long_long)(uVar11 & 1);
        TConstUnion::setBConst(pTVar13,SUB41(uVar11 & 1,0));
        break;
      case EOpIsInf:
        pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,(long)(int)dstType);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)(int)dstType);
        dVar17 = TConstUnion::getDConst(pTVar12);
        uVar11 = std::isinf(dVar17);
        local_1b0 = (unsigned_long_long)(uVar11 & 1);
        TConstUnion::setBConst(pTVar13,SUB41(uVar11 & 1,0));
        break;
      case EOpDPdx:
      case EOpDPdy:
      case EOpFwidth:
      case EOpDPdxFine:
      case EOpDPdyFine:
      case EOpFwidthFine:
      case EOpDPdxCoarse:
      case EOpDPdyCoarse:
      case EOpFwidthCoarse:
        local_1b0 = (unsigned_long_long)(int)dstType;
        pTVar13 = TConstUnionArray::operator[]((TConstUnionArray *)&unionArray,local_1b0);
        TConstUnion::setDConst(pTVar13,0.0);
      }
LAB_006fdb99:
    }
    this_local = (TIntermConstantUnion *)TIntermNode::operator_new((TIntermNode *)0xd0,local_1b0);
    TIntermConstantUnion(this_local,(TConstUnionArray *)&unionArray,returnType);
    iVar8 = (*(this_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1f])();
    lVar16 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar8) + 0x50))();
    *(ulong *)(lVar16 + 8) = *(ulong *)(lVar16 + 8) & 0xffffffffffffff80 | 2;
    iVar8 = (**(this->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode)();
    (*(this_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[1])
              (this_local,CONCAT44(extraout_var_04,iVar8));
  }
LAB_006fdc3b:
  TConstUnionArray::~TConstUnionArray((TConstUnionArray *)&unionArray);
  return &this_local->super_TIntermTyped;
}

Assistant:

TIntermTyped* TIntermConstantUnion::fold(TOperator op, const TType& returnType) const
{
    // First, size the result, which is mostly the same as the argument's size,
    // but not always, and classify what is componentwise.
    // Also, eliminate cases that can't be compile-time constant.
    int resultSize;
    bool componentWise = true;

    int objectSize = getType().computeNumComponents();
    switch (op) {
    case EOpDeterminant:
    case EOpAny:
    case EOpAll:
    case EOpLength:
        componentWise = false;
        resultSize = 1;
        break;

    case EOpEmitStreamVertex:
    case EOpEndStreamPrimitive:
        // These don't fold
        return nullptr;

    case EOpPackSnorm2x16:
    case EOpPackUnorm2x16:
    case EOpPackHalf2x16:
        componentWise = false;
        resultSize = 1;
        break;

    case EOpUnpackSnorm2x16:
    case EOpUnpackUnorm2x16:
    case EOpUnpackHalf2x16:
        componentWise = false;
        resultSize = 2;
        break;

    case EOpPack16:
    case EOpPack32:
    case EOpPack64:
    case EOpUnpack32:
    case EOpUnpack16:
    case EOpUnpack8:
    case EOpNormalize:
        componentWise = false;
        resultSize = objectSize;
        break;

    default:
        resultSize = objectSize;
        break;
    }

    // Set up for processing
    TConstUnionArray newConstArray(resultSize);
    const TConstUnionArray& unionArray = getConstArray();

    // Process non-component-wise operations
    switch (op) {
    case EOpLength:
    case EOpNormalize:
    {
        double sum = 0;
        for (int i = 0; i < objectSize; i++)
            sum += unionArray[i].getDConst() * unionArray[i].getDConst();
        double length = sqrt(sum);
        if (op == EOpLength)
            newConstArray[0].setDConst(length);
        else {
            for (int i = 0; i < objectSize; i++)
                newConstArray[i].setDConst(unionArray[i].getDConst() / length);
        }
        break;
    }

    case EOpAny:
    {
        bool result = false;
        for (int i = 0; i < objectSize; i++) {
            if (unionArray[i].getBConst())
                result = true;
        }
        newConstArray[0].setBConst(result);
        break;
    }
    case EOpAll:
    {
        bool result = true;
        for (int i = 0; i < objectSize; i++) {
            if (! unionArray[i].getBConst())
                result = false;
        }
        newConstArray[0].setBConst(result);
        break;
    }

    case EOpPackSnorm2x16:
    case EOpPackUnorm2x16:
    case EOpPackHalf2x16:
    case EOpPack16:
    case EOpPack32:
    case EOpPack64:
    case EOpUnpack32:
    case EOpUnpack16:
    case EOpUnpack8:

    case EOpUnpackSnorm2x16:
    case EOpUnpackUnorm2x16:
    case EOpUnpackHalf2x16:

    case EOpDeterminant:
    case EOpMatrixInverse:
    case EOpTranspose:
        return nullptr;

    default:
        assert(componentWise);
        break;
    }

    // Turn off the componentwise loop
    if (! componentWise)
        objectSize = 0;

    // Process component-wise operations
    for (int i = 0; i < objectSize; i++) {
        // First read the value and convert to i64/u64/f64/bool, then convert
        // to the destination type (still 64b), then convert down to the
        // destination size.
        if (IsOpNumericConv(op)) {
            enum ConvType { CONV_FLOAT, CONV_INT, CONV_UINT, CONV_BOOL };
            ConvType srcType = CONV_UINT, dstType = CONV_UINT;
            double valf = 0.0;
            uint64_t valu = 0;
            int64_t vali = 0;
            bool valb = false;
            switch (getType().getBasicType()) {
            case EbtDouble:
            case EbtFloat16:
            case EbtFloat:
                valf = unionArray[i].getDConst();
                srcType = CONV_FLOAT;
                break;
            case EbtInt8:
                vali = unionArray[i].getI8Const();
                srcType = CONV_INT;
                break;
            case EbtInt16:
                vali = unionArray[i].getI16Const();
                srcType = CONV_INT;
                break;
            case EbtInt:
                vali = unionArray[i].getIConst();
                srcType = CONV_INT;
                break;
            case EbtInt64:
                vali = unionArray[i].getI64Const();
                srcType = CONV_INT;
                break;
            case EbtUint8:
                valu = unionArray[i].getU8Const();
                srcType = CONV_UINT;
                break;
            case EbtUint16:
                valu = unionArray[i].getU16Const();
                srcType = CONV_UINT;
                break;
            case EbtUint:
                valu = unionArray[i].getUConst();
                srcType = CONV_UINT;
                break;
            case EbtUint64:
                valu = unionArray[i].getU64Const();
                srcType = CONV_UINT;
                break;
            case EbtBool:
                valb = unionArray[i].getBConst();
                srcType = CONV_BOOL;
                break;
            default:
                assert(0);
                break;
            }

            switch (returnType.getBasicType()) {
            case EbtDouble:
            case EbtFloat16:
            case EbtFloat:
                dstType = CONV_FLOAT;
                break;
            case EbtInt8:
            case EbtInt16:
            case EbtInt:
            case EbtInt64:
                dstType = CONV_INT;
                break;
            case EbtUint8:
            case EbtUint16:
            case EbtUint:
            case EbtUint64:
                dstType = CONV_UINT;
                break;
            case EbtBool:
                dstType = CONV_BOOL;
                break;
            default:
                assert(0);
                break;
            }
            if (dstType == CONV_BOOL) {
                switch (srcType) {
                case CONV_FLOAT:
                    valb = (valf != 0.0); break;
                case CONV_INT:
                    valb = (vali != 0.0); break;
                case CONV_UINT:
                    valb = (valu != 0.0); break;
                default:
                    break;
                }
            } else if (dstType == CONV_FLOAT) {
                switch (srcType) {
                case CONV_BOOL:
                    valf = (double)valb; break;
                case CONV_INT:
                    valf = (double)vali; break;
                case CONV_UINT:
                    valf = (double)valu; break;
                default:
                    break;
                }
            } else if (dstType == CONV_INT) {
                switch (srcType) {
                case CONV_BOOL:
                    vali = (int64_t)valb; break;
                case CONV_FLOAT:
                    vali = (int64_t)valf; break;
                case CONV_UINT:
                    vali = (int64_t)valu; break;
                default:
                    break;
                }
            } else if (dstType == CONV_UINT) {
                switch (srcType) {
                case CONV_BOOL:
                    valu = (uint64_t)valb; break;
                case CONV_FLOAT:
                    valu = (uint64_t)valf; break;
                case CONV_INT:
                    valu = (uint64_t)vali; break;
                default:
                    break;
                }
            }
            switch (returnType.getBasicType()) {
            case EbtDouble:
            case EbtFloat16:
            case EbtFloat:
                newConstArray[i].setDConst(valf); break;
            case EbtInt8:
                newConstArray[i].setI8Const(static_cast<int8_t>(vali)); break;
            case EbtInt16:
                newConstArray[i].setI16Const(static_cast<int16_t>(vali)); break;
            case EbtInt:
                newConstArray[i].setIConst(static_cast<int32_t>(vali)); break;
            case EbtInt64:
                newConstArray[i].setI64Const(vali); break;
            case EbtUint8:
                newConstArray[i].setU8Const(static_cast<uint8_t>(valu)); break;
            case EbtUint16:
                newConstArray[i].setU16Const(static_cast<uint16_t>(valu)); break;
            case EbtUint:
                newConstArray[i].setUConst(static_cast<uint32_t>(valu)); break;
            case EbtUint64:
                newConstArray[i].setU64Const(valu); break;
            case EbtBool:
                newConstArray[i].setBConst(valb); break;
            default:
                assert(0);
                break;
            }
            continue;
        }
        switch (op) {
        case EOpNegative:
            switch (getType().getBasicType()) {
            case EbtDouble:
            case EbtFloat16:
            case EbtFloat: newConstArray[i].setDConst(-unionArray[i].getDConst()); break;
            // Note: avoid UBSAN error regarding negating 0x80000000
            case EbtInt:   newConstArray[i].setIConst(
                                static_cast<unsigned int>(unionArray[i].getIConst()) == 0x80000000
                                    ? -0x7FFFFFFF - 1
                                    : -unionArray[i].getIConst());
                           break;
            case EbtUint:  newConstArray[i].setUConst(static_cast<unsigned int>(-static_cast<int>(unionArray[i].getUConst())));  break;
            case EbtInt8:  newConstArray[i].setI8Const(-unionArray[i].getI8Const()); break;
            case EbtUint8: newConstArray[i].setU8Const(static_cast<unsigned int>(-static_cast<signed int>(unionArray[i].getU8Const())));  break;
            case EbtInt16: newConstArray[i].setI16Const(-unionArray[i].getI16Const()); break;
            case EbtUint16:newConstArray[i].setU16Const(static_cast<unsigned int>(-static_cast<signed int>(unionArray[i].getU16Const())));  break;
            case EbtInt64: {
                int64_t i64val = unionArray[i].getI64Const();
                newConstArray[i].setI64Const(i64val == INT64_MIN ? INT64_MIN : -i64val);
                break;
            }
            case EbtUint64: newConstArray[i].setU64Const(static_cast<unsigned long long>(-static_cast<long long>(unionArray[i].getU64Const())));  break;
            default:
                return nullptr;
            }
            break;
        case EOpLogicalNot:
        case EOpVectorLogicalNot:
            switch (getType().getBasicType()) {
            case EbtBool:  newConstArray[i].setBConst(!unionArray[i].getBConst()); break;
            default:
                return nullptr;
            }
            break;
        case EOpBitwiseNot:
            newConstArray[i] = ~unionArray[i];
            break;
        case EOpRadians:
            newConstArray[i].setDConst(unionArray[i].getDConst() * pi / 180.0);
            break;
        case EOpDegrees:
            newConstArray[i].setDConst(unionArray[i].getDConst() * 180.0 / pi);
            break;
        case EOpSin:
            newConstArray[i].setDConst(sin(unionArray[i].getDConst()));
            break;
        case EOpCos:
            newConstArray[i].setDConst(cos(unionArray[i].getDConst()));
            break;
        case EOpTan:
            newConstArray[i].setDConst(tan(unionArray[i].getDConst()));
            break;
        case EOpAsin:
            newConstArray[i].setDConst(asin(unionArray[i].getDConst()));
            break;
        case EOpAcos:
            newConstArray[i].setDConst(acos(unionArray[i].getDConst()));
            break;
        case EOpAtan:
            newConstArray[i].setDConst(atan(unionArray[i].getDConst()));
            break;

        case EOpDPdx:
        case EOpDPdy:
        case EOpFwidth:
        case EOpDPdxFine:
        case EOpDPdyFine:
        case EOpFwidthFine:
        case EOpDPdxCoarse:
        case EOpDPdyCoarse:
        case EOpFwidthCoarse:
            // The derivatives are all mandated to create a constant 0.
            newConstArray[i].setDConst(0.0);
            break;

        case EOpExp:
            newConstArray[i].setDConst(exp(unionArray[i].getDConst()));
            break;
        case EOpLog:
            newConstArray[i].setDConst(log(unionArray[i].getDConst()));
            break;
        case EOpExp2:
            newConstArray[i].setDConst(exp2(unionArray[i].getDConst()));
            break;
        case EOpLog2:
            newConstArray[i].setDConst(log2(unionArray[i].getDConst()));
            break;
        case EOpSqrt:
            newConstArray[i].setDConst(sqrt(unionArray[i].getDConst()));
            break;
        case EOpInverseSqrt:
            newConstArray[i].setDConst(1.0 / sqrt(unionArray[i].getDConst()));
            break;

        case EOpAbs:
            if (unionArray[i].getType() == EbtDouble)
                newConstArray[i].setDConst(fabs(unionArray[i].getDConst()));
            else if (unionArray[i].getType() == EbtInt)
                newConstArray[i].setIConst(abs(unionArray[i].getIConst()));
            else
                newConstArray[i] = unionArray[i];
            break;
        case EOpSign:
            #define SIGN(X) (X == 0 ? 0 : (X < 0 ? -1 : 1))
            if (unionArray[i].getType() == EbtDouble)
                newConstArray[i].setDConst(SIGN(unionArray[i].getDConst()));
            else
                newConstArray[i].setIConst(SIGN(unionArray[i].getIConst()));
            break;
        case EOpFloor:
            newConstArray[i].setDConst(floor(unionArray[i].getDConst()));
            break;
        case EOpTrunc:
            if (unionArray[i].getDConst() > 0)
                newConstArray[i].setDConst(floor(unionArray[i].getDConst()));
            else
                newConstArray[i].setDConst(ceil(unionArray[i].getDConst()));
            break;
        case EOpRound:
            newConstArray[i].setDConst(floor(0.5 + unionArray[i].getDConst()));
            break;
        case EOpRoundEven:
        {
            double flr = floor(unionArray[i].getDConst());
            bool even = flr / 2.0 == floor(flr / 2.0);
            double rounded = even ? ceil(unionArray[i].getDConst() - 0.5) : floor(unionArray[i].getDConst() + 0.5);
            newConstArray[i].setDConst(rounded);
            break;
        }
        case EOpCeil:
            newConstArray[i].setDConst(ceil(unionArray[i].getDConst()));
            break;
        case EOpFract:
        {
            double x = unionArray[i].getDConst();
            newConstArray[i].setDConst(x - floor(x));
            break;
        }

        case EOpIsNan:
        {
            newConstArray[i].setBConst(std::isnan(unionArray[i].getDConst()));
            break;
        }
        case EOpIsInf:
        {
            newConstArray[i].setBConst(std::isinf(unionArray[i].getDConst()));
            break;
        }

        case EOpConvPtrToUint64:
        case EOpConvUint64ToPtr:
        case EOpConstructReference:
            newConstArray[i].setU64Const(unionArray[i].getU64Const()); break;

        // TODO: 3.0 Functionality: unary constant folding: the rest of the ops have to be fleshed out

        case EOpSinh:
        case EOpCosh:
        case EOpTanh:
        case EOpAsinh:
        case EOpAcosh:
        case EOpAtanh:

        case EOpFloatBitsToInt:
        case EOpFloatBitsToUint:
        case EOpIntBitsToFloat:
        case EOpUintBitsToFloat:
        case EOpDoubleBitsToInt64:
        case EOpDoubleBitsToUint64:
        case EOpInt64BitsToDouble:
        case EOpUint64BitsToDouble:
        case EOpFloat16BitsToInt16:
        case EOpFloat16BitsToUint16:
        case EOpInt16BitsToFloat16:
        case EOpUint16BitsToFloat16:
        default:
            return nullptr;
        }
    }

    TIntermConstantUnion *newNode = new TIntermConstantUnion(newConstArray, returnType);
    newNode->getWritableType().getQualifier().storage = EvqConst;
    newNode->setLoc(getLoc());

    return newNode;
}